

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unix_address.cpp
# Opt level: O3

void __thiscall sockpp::unix_address::unix_address(unix_address *this,string *path)

{
  ulong uVar1;
  system_error *this_00;
  error_category *peVar2;
  ulong uVar3;
  error_code __ec;
  
  (this->super_sock_address)._vptr_sock_address = (_func_int **)&PTR__sock_address_0010bcf0;
  (this->addr_).sun_family = 0;
  (this->addr_).sun_path[0] = '\0';
  (this->addr_).sun_path[1] = '\0';
  (this->addr_).sun_path[2] = '\0';
  (this->addr_).sun_path[3] = '\0';
  (this->addr_).sun_path[4] = '\0';
  (this->addr_).sun_path[5] = '\0';
  (this->addr_).sun_path[6] = '\0';
  (this->addr_).sun_path[7] = '\0';
  (this->addr_).sun_path[8] = '\0';
  (this->addr_).sun_path[9] = '\0';
  (this->addr_).sun_path[10] = '\0';
  (this->addr_).sun_path[0xb] = '\0';
  (this->addr_).sun_path[0xc] = '\0';
  (this->addr_).sun_path[0xd] = '\0';
  (this->addr_).sun_path[0xe] = '\0';
  (this->addr_).sun_path[0xf] = '\0';
  (this->addr_).sun_path[0x10] = '\0';
  (this->addr_).sun_path[0x11] = '\0';
  (this->addr_).sun_path[0x12] = '\0';
  (this->addr_).sun_path[0x13] = '\0';
  (this->addr_).sun_path[0x14] = '\0';
  (this->addr_).sun_path[0x15] = '\0';
  (this->addr_).sun_path[0x16] = '\0';
  (this->addr_).sun_path[0x17] = '\0';
  (this->addr_).sun_path[0x18] = '\0';
  (this->addr_).sun_path[0x19] = '\0';
  (this->addr_).sun_path[0x1a] = '\0';
  (this->addr_).sun_path[0x1b] = '\0';
  (this->addr_).sun_path[0x1c] = '\0';
  (this->addr_).sun_path[0x1d] = '\0';
  (this->addr_).sun_path[0x1e] = '\0';
  (this->addr_).sun_path[0x1f] = '\0';
  (this->addr_).sun_path[0x20] = '\0';
  (this->addr_).sun_path[0x21] = '\0';
  (this->addr_).sun_path[0x22] = '\0';
  (this->addr_).sun_path[0x23] = '\0';
  (this->addr_).sun_path[0x24] = '\0';
  (this->addr_).sun_path[0x25] = '\0';
  (this->addr_).sun_path[0x26] = '\0';
  (this->addr_).sun_path[0x27] = '\0';
  (this->addr_).sun_path[0x28] = '\0';
  (this->addr_).sun_path[0x29] = '\0';
  (this->addr_).sun_path[0x2a] = '\0';
  (this->addr_).sun_path[0x2b] = '\0';
  (this->addr_).sun_path[0x2c] = '\0';
  (this->addr_).sun_path[0x2d] = '\0';
  (this->addr_).sun_path[0x2e] = '\0';
  (this->addr_).sun_path[0x2f] = '\0';
  (this->addr_).sun_path[0x30] = '\0';
  (this->addr_).sun_path[0x31] = '\0';
  (this->addr_).sun_path[0x32] = '\0';
  (this->addr_).sun_path[0x33] = '\0';
  (this->addr_).sun_path[0x34] = '\0';
  (this->addr_).sun_path[0x35] = '\0';
  (this->addr_).sun_path[0x36] = '\0';
  (this->addr_).sun_path[0x37] = '\0';
  (this->addr_).sun_path[0x38] = '\0';
  (this->addr_).sun_path[0x39] = '\0';
  (this->addr_).sun_path[0x3a] = '\0';
  (this->addr_).sun_path[0x3b] = '\0';
  (this->addr_).sun_path[0x3c] = '\0';
  (this->addr_).sun_path[0x3d] = '\0';
  (this->addr_).sun_path[0x3e] = '\0';
  (this->addr_).sun_path[0x3f] = '\0';
  (this->addr_).sun_path[0x40] = '\0';
  (this->addr_).sun_path[0x41] = '\0';
  (this->addr_).sun_path[0x42] = '\0';
  (this->addr_).sun_path[0x43] = '\0';
  (this->addr_).sun_path[0x44] = '\0';
  (this->addr_).sun_path[0x45] = '\0';
  (this->addr_).sun_path[0x46] = '\0';
  (this->addr_).sun_path[0x47] = '\0';
  (this->addr_).sun_path[0x48] = '\0';
  (this->addr_).sun_path[0x49] = '\0';
  (this->addr_).sun_path[0x4a] = '\0';
  (this->addr_).sun_path[0x4b] = '\0';
  (this->addr_).sun_path[0x4c] = '\0';
  (this->addr_).sun_path[0x4d] = '\0';
  (this->addr_).sun_path[0x4e] = '\0';
  (this->addr_).sun_path[0x4f] = '\0';
  (this->addr_).sun_path[0x50] = '\0';
  (this->addr_).sun_path[0x51] = '\0';
  (this->addr_).sun_path[0x52] = '\0';
  (this->addr_).sun_path[0x53] = '\0';
  (this->addr_).sun_path[0x54] = '\0';
  (this->addr_).sun_path[0x55] = '\0';
  (this->addr_).sun_path[0x56] = '\0';
  (this->addr_).sun_path[0x57] = '\0';
  (this->addr_).sun_path[0x58] = '\0';
  (this->addr_).sun_path[0x59] = '\0';
  (this->addr_).sun_path[0x5a] = '\0';
  (this->addr_).sun_path[0x5b] = '\0';
  (this->addr_).sun_path[0x5c] = '\0';
  (this->addr_).sun_path[0x5d] = '\0';
  (this->addr_).sun_path[0x5c] = '\0';
  (this->addr_).sun_path[0x5d] = '\0';
  (this->addr_).sun_path[0x5e] = '\0';
  (this->addr_).sun_path[0x5f] = '\0';
  (this->addr_).sun_path[0x60] = '\0';
  (this->addr_).sun_path[0x61] = '\0';
  (this->addr_).sun_path[0x62] = '\0';
  (this->addr_).sun_path[99] = '\0';
  (this->addr_).sun_path[100] = '\0';
  (this->addr_).sun_path[0x65] = '\0';
  (this->addr_).sun_path[0x66] = '\0';
  (this->addr_).sun_path[0x67] = '\0';
  (this->addr_).sun_path[0x68] = '\0';
  (this->addr_).sun_path[0x69] = '\0';
  (this->addr_).sun_path[0x6a] = '\0';
  (this->addr_).sun_path[0x6b] = '\0';
  uVar1 = path->_M_string_length;
  if (uVar1 < 0x6d) {
    (this->addr_).sun_family = 1;
    uVar3 = 0x6b;
    if (uVar1 < 0x6b) {
      uVar3 = uVar1;
    }
    memcpy((this->addr_).sun_path,(path->_M_dataplus)._M_p,uVar3 + 1);
    return;
  }
  this_00 = (system_error *)__cxa_allocate_exception(0x20);
  peVar2 = (error_category *)std::_V2::generic_category();
  __ec._M_cat = peVar2;
  __ec._0_8_ = 0x16;
  std::system_error::system_error(this_00,__ec);
  __cxa_throw(this_00,&std::system_error::typeinfo,std::system_error::~system_error);
}

Assistant:

unix_address::unix_address(const string& path) {
    if (path.length() > MAX_PATH_NAME)
        throw system_error{make_error_code(errc::invalid_argument)};

    addr_.sun_family = ADDRESS_FAMILY;
    // Remember, if len==MAX, there's no NUL terminator
    const size_t n = std::min(path.length() + 1, MAX_PATH_NAME);
    std::memcpy(addr_.sun_path, path.c_str(), n);
}